

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O1

HTMLElement * __thiscall
soul::HTMLGenerator::createModuleSection(HTMLGenerator *this,HTMLElement *parent,string_view name)

{
  HTMLElement *pHVar1;
  string_view value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pHVar1 = choc::html::HTMLElement::addDiv(parent);
  value._M_str = "module_section";
  value._M_len = 0xe;
  pHVar1 = choc::html::HTMLElement::setClass(pHVar1,value);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"h3","");
  std::vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>>::
  emplace_back<std::__cxx11::string>
            ((vector<choc::html::HTMLElement,std::allocator<choc::html::HTMLElement>> *)
             &pHVar1->children,&local_48);
  choc::html::HTMLElement::addContent
            ((pHVar1->children).
             super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1,name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return pHVar1;
}

Assistant:

choc::html::HTMLElement& createModuleSection (choc::html::HTMLElement& parent, std::string_view name)
    {
        auto& list = parent.addDiv ("module_section");
        list.addChild ("h3").addContent (name);
        return list;
    }